

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O2

DishType __thiscall Restaurant::findMyType(Restaurant *this,string *strType)

{
  bool bVar1;
  DishType DVar2;
  
  bVar1 = std::operator==(strType,"ALC");
  if (bVar1) {
    DVar2 = ALC;
  }
  else {
    bVar1 = std::operator==(strType,"VEG");
    DVar2 = VEG;
    if (!bVar1) {
      bVar1 = std::operator==(strType,"SPC");
      DVar2 = BVG - bVar1;
    }
  }
  return DVar2;
}

Assistant:

DishType Restaurant::findMyType(std::string strType)
{
    if(strType == "ALC")
        return ALC;
    if(strType == "VEG")
        return VEG;
    if(strType == "SPC")
        return SPC;
    else
        return BVG;
}